

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

size_t __thiscall Memory::Recycler::BackgroundFindRoots(Recycler *this)

{
  size_t *psVar1;
  NodeBase *pNVar2;
  ObservableValueObserver<Memory::CollectionState> *pOVar3;
  code *pcVar4;
  bool bVar5;
  CollectionState CVar6;
  undefined4 *puVar7;
  size_t sVar8;
  GuestArenaAllocator *pGVar9;
  size_t sVar10;
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *pDVar11;
  undefined1 local_50 [8];
  EditingIterator guestArenaIter;
  CollectionState local_34;
  
  pNVar2 = (NodeBase *)(this->collectionStats).markData.markCount;
  if ((this->collectionState).value != CollectionStateConcurrentFindRoots) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f6,"(this->IsConcurrentFindRootState())",
                       "this->IsConcurrentFindRootState()");
    if (!bVar5) goto LAB_00714987;
    *puVar7 = 0;
  }
  if (this->hasPendingConcurrentFindRoot == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f7,"(this->hasPendingConcurrentFindRoot)",
                       "this->hasPendingConcurrentFindRoot");
    if (!bVar5) goto LAB_00714987;
    *puVar7 = 0;
  }
  if ((this->inPartialCollectMode == false) && (bVar5 = DoQueueTrackedObject(this), !bVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f9,"(this->inPartialCollectMode || this->DoQueueTrackedObject())",
                       "this->inPartialCollectMode || this->DoQueueTrackedObject()");
    if (!bVar5) {
LAB_00714987:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  guestArenaIter.super_Iterator.current = pNVar2;
  sVar8 = ScanPinnedObjects<true>(this);
  pDVar11 = &this->guestArenaList;
  local_50 = (undefined1  [8])pDVar11;
  guestArenaIter.super_Iterator.list = pDVar11;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_0071482f:
  if (pDVar11 == (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar5) goto LAB_00714987;
    *puVar7 = 0;
    pDVar11 = guestArenaIter.super_Iterator.list;
  }
  guestArenaIter.super_Iterator.list =
       (pDVar11->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list;
  if ((undefined1  [8])guestArenaIter.super_Iterator.list == local_50) {
    guestArenaIter.super_Iterator.list =
         (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
    ScanImplicitRoots(this);
    pNVar2 = guestArenaIter.super_Iterator.current;
    this->hasPendingConcurrentFindRoot = false;
    local_34 = CollectionStateConcurrentMark;
    pOVar3 = (this->collectionState).observer;
    CVar6 = CollectionStateConcurrentMark;
    if ((pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
       ((this->collectionState).value != CollectionStateConcurrentMark)) {
      (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,&local_34,&this->collectionState);
      CVar6 = local_34;
    }
    (this->collectionState).value = CVar6;
    psVar1 = &(this->collectionStats).rootCount;
    *psVar1 = *psVar1 + ((this->collectionStats).markData.markCount - (long)pNVar2);
    return sVar8;
  }
  pGVar9 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                     ((Iterator *)local_50);
  if (pGVar9->pendingDelete == true) {
    pDVar11 = guestArenaIter.super_Iterator.list;
    if (this->hasPendingDeleteGuestArena == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1616,"(this->hasPendingDeleteGuestArena)",
                         "this->hasPendingDeleteGuestArena");
      if (!bVar5) goto LAB_00714987;
      *puVar7 = 0;
      pDVar11 = guestArenaIter.super_Iterator.list;
    }
  }
  else {
    sVar10 = ScanArena(this,&(pGVar9->super_ArenaAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .super_ArenaData,true);
    sVar8 = sVar8 + sVar10;
    pDVar11 = guestArenaIter.super_Iterator.list;
  }
  goto LAB_0071482f;
}

Assistant:

size_t
Recycler::BackgroundFindRoots()
{
#ifdef RECYCLER_STATS
    size_t lastMarkCount = this->collectionStats.markData.markCount;
#endif

    size_t scanRootBytes = 0;
    Assert(this->IsConcurrentFindRootState());
    Assert(this->hasPendingConcurrentFindRoot);
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || this->DoQueueTrackedObject());
#else
    Assert(this->DoQueueTrackedObject());
#endif

    // Only mark pinned object and guest arenas, which is where most of the roots are.
    // When we go back to the main thread to rescan, we will scan the rest of the root.

    // NOTE: purposefully not marking the transientPinnedObject there. as it is transient :)

    // background mark the pinned object. Since we are in concurrent find root state
    // the main thread won't delete any entries from the map, so concurrent read
    // to the map safe.

    GCETW(GC_BACKGROUNDSCANROOTS_START, (this));
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::BackgroundFindRootsPhase);

    scanRootBytes += this->ScanPinnedObjects</*background = */true>();

    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::FindRootArenaPhase);
    // background mark the guest arenas. Since we are in concurrent find root state
    // the main thread won't delete any arena, so concurrent reads to them are ok.
    DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        GuestArenaAllocator& allocator = guestArenaIter.Data();
        if (allocator.pendingDelete)
        {
            // Skip guest arena that are already marked for delete
            Assert(this->hasPendingDeleteGuestArena);
            continue;
        }
        scanRootBytes += ScanArena(&allocator, true);
    }
    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::FindRootArenaPhase);

    this->ScanImplicitRoots();

    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::BackgroundFindRootsPhase);
    this->hasPendingConcurrentFindRoot = false;
    this->SetCollectionState(CollectionStateConcurrentMark);

    GCETW(GC_BACKGROUNDSCANROOTS_STOP, (this));
    RECYCLER_STATS_ADD(this, rootCount, this->collectionStats.markData.markCount - lastMarkCount);

    return scanRootBytes;
}